

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O0

void __thiscall
soul::heart::Utilities::
GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
::check(GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
        *this,Node *node,
       vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
       *visitedStack,CodeLocation *errorContext)

{
  Node *this_00;
  CodeLocation *node_00;
  bool bVar1;
  pointer *this_01;
  Source *pSVar2;
  CodeLocation *visitedStack_00;
  ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>
  stack;
  Source *source;
  Source *__end0;
  Source *__begin0;
  ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node::Source,_4UL>
  *__range3;
  GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
  *local_58;
  Node **local_50;
  __normal_iterator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_**,_std::vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>_>
  local_48;
  Node *local_40;
  Node **local_38;
  __normal_iterator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_**,_std::vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>_>
  local_30;
  __normal_iterator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_**,_std::vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>_>
  local_28;
  vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
  *local_20;
  CodeLocation *errorContext_local;
  vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
  *visitedStack_local;
  Node *node_local;
  
  local_20 = visitedStack;
  errorContext_local = (CodeLocation *)node;
  visitedStack_local =
       (vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
        *)this;
  local_30._M_current =
       (Node **)std::
                vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
                ::begin((vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
                         *)node);
  local_38 = (Node **)std::
                      vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
                      ::end((vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
                             *)errorContext_local);
  local_40 = (Node *)visitedStack_local;
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const**,std::vector<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*>>>,soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*>
                       (local_30,(__normal_iterator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_**,_std::vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>_>
                                  )local_38,&local_40);
  local_48._M_current =
       (Node **)std::
                vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
                ::end((vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
                       *)errorContext_local);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_48);
  if (bVar1) {
    ArrayView<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*>
    ::
    ArrayView<std::vector<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*>>>
              ((ArrayView<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*>
                *)&local_58,
               (vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
                *)errorContext_local);
    stack.e = (Node **)local_20;
    stack.s = local_50;
    throwCycleError(local_58,stack,errorContext);
  }
  __range3 = (ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node::Source,_4UL>
              *)visitedStack_local;
  std::
  vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
  ::push_back((vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
               *)errorContext_local,(value_type *)&__range3);
  this_01 = &(visitedStack_local->
             super__Vector_base<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  __end0 = ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node::Source,_4UL>
           ::begin((ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node::Source,_4UL>
                    *)this_01);
  pSVar2 = ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node::Source,_4UL>
           ::end((ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node::Source,_4UL>
                  *)this_01);
  for (; node_00 = errorContext_local, __end0 != pSVar2; __end0 = __end0 + 1) {
    this_00 = __end0->node;
    visitedStack_00 = CycleDetector::getContext(__end0->connection);
    check((GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
           *)this_00,(Node *)node_00,
          (vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
           *)visitedStack_00,errorContext);
  }
  std::
  vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
  ::pop_back((vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
              *)errorContext_local);
  return;
}

Assistant:

static void check (const Node& node, std::vector<const Node*>& visitedStack, const ContextType& errorContext)
        {
            if (std::find (visitedStack.begin(), visitedStack.end(), std::addressof (node)) != visitedStack.end())
                throwCycleError (visitedStack, errorContext);

            visitedStack.push_back (std::addressof (node));

            for (auto& source : node.sources)
                check (source.node, visitedStack, Subclass::getContext (source.connection));

            visitedStack.pop_back();
        }